

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_csharp.cpp
# Opt level: O2

string * __thiscall
flatbuffers::csharp::CSharpGenerator::GenDefaultValueBasic_abi_cxx11_
          (string *__return_storage_ptr__,CSharpGenerator *this,FieldDef *field,
          bool enableLangOverrides)

{
  BaseType BVar1;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  
  BVar1 = (field->value).type.base_type;
  if (BVar1 - BASE_TYPE_UTYPE < 0xc) {
    GenDefaultValue_abi_cxx11_(__return_storage_ptr__,this,field,enableLangOverrides);
    return __return_storage_ptr__;
  }
  if (enableLangOverrides) {
    if (BVar1 == BASE_TYPE_STRUCT) {
      NamespacedName_abi_cxx11_(&local_30,this,&((field->value).type.struct_def)->super_Definition);
      std::operator+(&local_50,"default(Offset<",&local_30);
      std::operator+(__return_storage_ptr__,&local_50,">)");
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_30);
      return __return_storage_ptr__;
    }
    if (BVar1 == BASE_TYPE_VECTOR) {
      __s = "default(VectorOffset)";
      goto LAB_0017fb8e;
    }
    if (BVar1 == BASE_TYPE_STRING) {
      __s = "default(StringOffset)";
      goto LAB_0017fb8e;
    }
  }
  __s = "0";
LAB_0017fb8e:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,__s,(allocator<char> *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string GenDefaultValueBasic(const FieldDef &field,
                                   bool enableLangOverrides) const {
    auto &value = field.value;
    if (!IsScalar(value.type.base_type)) {
      if (enableLangOverrides) {
        switch (value.type.base_type) {
          case BASE_TYPE_STRING: return "default(StringOffset)";
          case BASE_TYPE_STRUCT:
            return "default(Offset<" + NamespacedName(*value.type.struct_def) +
                   ">)";
          case BASE_TYPE_VECTOR: return "default(VectorOffset)";
          default: break;
        }
      }
      return "0";
    }
    return GenDefaultValue(field, enableLangOverrides);
  }